

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::TestCaseStats::~TestCaseStats(TestCaseStats *this)

{
  ~TestCaseStats(this);
  operator_delete(this,0x130);
  return;
}

Assistant:

TestCaseStats::~TestCaseStats() = default;